

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O2

bool __thiscall soplex::SPxDevexPR<double>::isConsistent(SPxDevexPR<double> *this)

{
  return true;
}

Assistant:

bool SPxDevexPR<R>::isConsistent() const
{
#ifdef ENABLE_CONSISTENCY_CHECKS

   if(this->thesolver != nullptr)
      if(this->thesolver->weights.dim() != this->thesolver->coDim()
            || this->thesolver->coWeights.dim() != this->thesolver->dim())
         return SPX_MSG_INCONSISTENT("SPxDevexPR");

#endif

   return true;
}